

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

bool __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::readFile
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,IFileReadCallBack *callback)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong *pointerToStore;
  ulong uVar5;
  
  uVar2 = (*callback->_vptr_IFileReadCallBack[3])(callback);
  uVar1 = uVar2 + 4;
  uVar4 = 0xffffffff;
  if (-5 < (int)uVar2) {
    uVar4 = uVar1;
  }
  pointerToStore = (ulong *)operator_new__((long)(int)uVar4);
  iVar3 = (*callback->_vptr_IFileReadCallBack[2])(callback,pointerToStore,(ulong)uVar2);
  if (iVar3 == 0) {
    operator_delete__(pointerToStore);
    goto LAB_006d43c5;
  }
  *(undefined4 *)((long)pointerToStore + (long)(int)uVar2) = 0;
  if (-1 < (int)uVar2) {
    uVar5 = *pointerToStore;
    if (uVar5 == 0xfeff) {
      this->SourceFormat = ETF_UTF32_LE;
    }
    else {
      if (uVar5 != 0xfffffffffffe0000) goto LAB_006d4355;
      this->SourceFormat = ETF_UTF32_BE;
    }
    convertTextData<unsigned_long>(this,pointerToStore + 1,(char *)pointerToStore,uVar1 >> 2);
    goto LAB_006d43c5;
  }
  if (uVar2 < 0xfffffffe) {
LAB_006d4370:
    this->SourceFormat = ETF_ASCII;
    this->TextBegin = (char *)pointerToStore;
    this->TextData = (char *)pointerToStore;
    this->TextSize = uVar1;
  }
  else {
    uVar5 = (ulong)(ushort)*pointerToStore;
LAB_006d4355:
    uVar4 = (uint)uVar5 & 0xffff;
    if (uVar4 == 0xfeff) {
      this->SourceFormat = ETF_UTF16_LE;
    }
    else {
      if (uVar4 != 0xfffe) goto LAB_006d4370;
      this->SourceFormat = ETF_UTF16_BE;
    }
    convertTextData<unsigned_short>
              (this,(unsigned_short *)((long)pointerToStore + 2),(char *)pointerToStore,uVar1 >> 1);
  }
LAB_006d43c5:
  return iVar3 != 0;
}

Assistant:

bool readFile(IFileReadCallBack* callback)
	{
		int size = callback->getSize();		
		size += 4; // We need two terminating 0's at the end.
		           // For ASCII we need 1 0's, for UTF-16 2, for UTF-32 4.

		char* data8 = new char[size];

		if (!callback->read(data8, size-4))
		{
			delete [] data8;
			return false;
		}

		// add zeros at end

		data8[size-1] = 0;
		data8[size-2] = 0;
		data8[size-3] = 0;
		data8[size-4] = 0;

		char16* data16 = reinterpret_cast<char16*>(data8);
		char32* data32 = reinterpret_cast<char32*>(data8);	

		// now we need to convert the data to the desired target format
		// based on the byte order mark.

		const unsigned char UTF8[] = {0xEF, 0xBB, 0xBF}; // 0xEFBBBF;
		const int UTF16_BE = 0xFFFE;
		const int UTF16_LE = 0xFEFF;
		const int UTF32_BE = 0xFFFE0000;
		const int UTF32_LE = 0x0000FEFF;

		// check source for all utf versions and convert to target data format
		
		if (size >= 4 && data32[0] == (char32)UTF32_BE)
		{
			// UTF-32, big endian
			SourceFormat = ETF_UTF32_BE;
			convertTextData(data32+1, data8, (size/4)); // data32+1 because we need to skip the header
		}
		else
		if (size >= 4 && data32[0] == (char32)UTF32_LE)
		{
			// UTF-32, little endian
			SourceFormat = ETF_UTF32_LE;
			convertTextData(data32+1, data8, (size/4)); // data32+1 because we need to skip the header
		}
		else
		if (size >= 2 && data16[0] == UTF16_BE)
		{
			// UTF-16, big endian
			SourceFormat = ETF_UTF16_BE;
			convertTextData(data16+1, data8, (size/2)); // data16+1 because we need to skip the header
		}
		else
		if (size >= 2 && data16[0] == UTF16_LE)
		{
			// UTF-16, little endian
			SourceFormat = ETF_UTF16_LE;
			convertTextData(data16+1, data8, (size/2)); // data16+1 because we need to skip the header
		}
		else
		if (size >= 3 && data8[0] == UTF8[0] && data8[1] == UTF8[1] && data8[2] == UTF8[2])
		{
			// UTF-8
			SourceFormat = ETF_UTF8;
			convertTextData(data8+3, data8, size); // data8+3 because we need to skip the header
		}
		else
		{
			// ASCII
			SourceFormat = ETF_ASCII;
			convertTextData(data8, data8, size);
		}

		return true;
	}